

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::tools::ByteBufferTEst_test_read_write_double_Test::TestBody
          (ByteBufferTEst_test_read_write_double_Test *this)

{
  bool bVar1;
  char *pcVar2;
  double double2;
  AssertionResult gtest_ar_1;
  double double1;
  ByteBuffer byte_buffer2;
  ByteBuffer byte_buffer1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  AssertHelper local_90;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  AssertHelper local_78;
  double local_70;
  internal local_68 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60 [5];
  ByteBuffer local_38 [48];
  
  local_70 = 583824.324;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(local_38,8);
  bidfx_public_api::tools::ByteBuffer::WriteDouble(583824.324);
  local_88.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       bidfx_public_api::tools::ByteBuffer::ReadDouble();
  testing::internal::CmpHelperEQ<double,double>
            (local_68,"double1","byte_buffer1.ReadDouble()",&local_70,(double *)&local_88);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_60[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_60[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xbe,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_88.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_88.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_90.data_ = (AssertHelperData *)0xc11d31d1b126e979;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer((ByteBuffer *)local_68,4);
  bidfx_public_api::tools::ByteBuffer::WriteDouble(-478324.423);
  local_98.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       bidfx_public_api::tools::ByteBuffer::ReadDouble();
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_88,"double2","byte_buffer2.ReadDouble()",(double *)&local_90,
             (double *)&local_98);
  if (local_88.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_80.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_80.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xc3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_98.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_98.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_98.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)local_68);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_38);
  return;
}

Assistant:

TEST(ByteBufferTEst, test_read_write_double)
{
    double double1 = 583824.324;
    ByteBuffer byte_buffer1(8);
    byte_buffer1.WriteDouble(double1);
    EXPECT_EQ(double1, byte_buffer1.ReadDouble());

    double double2 = -478324.423;
    ByteBuffer byte_buffer2(4);
    byte_buffer2.WriteDouble(double2);
    EXPECT_EQ(double2, byte_buffer2.ReadDouble());
}